

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_id_provider.cpp
# Opt level: O0

HT_EventId ht_event_id_provider_next(HT_EventIdProvider *provider)

{
  __int_type _Var1;
  HT_EventIdProvider *provider_local;
  
  _Var1 = std::__atomic_base<unsigned_long>::operator++((__atomic_base<unsigned_long> *)provider,0);
  return _Var1;
}

Assistant:

HT_EventId
ht_event_id_provider_next(HT_EventIdProvider* provider)
{
#if defined(HT_CPP11) || !defined(HT_ENABLE_THREADS)
    return provider->current_identifier++;
#elif defined(__GNUC__)
#  if !defined(__GNUC_PREREQ) && defined(__GNUC_MINOR__)
#    define __GNUC_PREREQ(maj,min) ((__GNUC__ << 16) + __GNUC_MINOR__ >= ((maj) << 16) + (min))
#  endif
#  if defined(__GNUC_PREREQ) && __GNUC_PREREQ(4, 7)
    return __atomic_add_fetch(&provider->current_identifier, 1, __ATOMIC_SEQ_CST) - 1;
#  elif defined(__GNUC_PREREQ) && __GNUC_PREREQ(4, 1)
    return __sync_fetch_and_add(&provider->current_identifier, 1);
#  endif
#else
#  error "Atomic Fetch&Add is not supported"
#endif
}